

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  
  lVar1 = d->v[0];
  lVar2 = d->v[4];
  lVar3 = e->v[4];
  uVar4 = t->u;
  uVar5 = t->v;
  uVar6 = t->q;
  uVar7 = t->r;
  lVar9 = (uVar5 & lVar3 >> 0x3f) + (uVar4 & lVar2 >> 0x3f);
  lVar20 = (lVar3 >> 0x3f & uVar7) + (lVar2 >> 0x3f & uVar6);
  lVar19 = e->v[0];
  uVar11 = uVar5 * lVar19 + uVar4 * lVar1;
  uVar17 = uVar7 * lVar19 + uVar6 * lVar1;
  lVar9 = lVar9 - (modinfo->modulus_inv62 * uVar11 + lVar9 & 0x3fffffffffffffff);
  lVar20 = lVar20 - (modinfo->modulus_inv62 * uVar17 + lVar20 & 0x3fffffffffffffff);
  lVar8 = (modinfo->modulus).v[0];
  lVar21 = SUB168(SEXT816(lVar9) * SEXT816(lVar8),8) +
           SUB168(SEXT816((long)uVar5) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar4) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar5 * lVar19,uVar4 * lVar1) + (ulong)CARRY8(lVar9 * lVar8,uVar11);
  lVar12 = SUB168(SEXT816(lVar20) * SEXT816(lVar8),8) +
           SUB168(SEXT816((long)uVar7) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar7 * lVar19,uVar6 * lVar1) + (ulong)CARRY8(lVar20 * lVar8,uVar17);
  uVar22 = lVar21 * 4 | lVar9 * lVar8 + uVar11 >> 0x3e;
  uVar13 = lVar12 * 4 | lVar20 * lVar8 + uVar17 >> 0x3e;
  lVar1 = d->v[1];
  lVar19 = e->v[1];
  uVar11 = uVar5 * lVar19 + uVar4 * lVar1;
  uVar18 = uVar11 + uVar22;
  lVar21 = SUB168(SEXT816((long)uVar5) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar4) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar5 * lVar19,uVar4 * lVar1) + (lVar21 >> 0x3e) +
           (ulong)CARRY8(uVar11,uVar22);
  uVar11 = uVar7 * lVar19 + uVar6 * lVar1;
  uVar17 = uVar11 + uVar13;
  lVar12 = SUB168(SEXT816((long)uVar7) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar7 * lVar19,uVar6 * lVar1) + (lVar12 >> 0x3e) +
           (ulong)CARRY8(uVar11,uVar13);
  lVar1 = d->v[2];
  lVar19 = e->v[2];
  lVar8 = (modinfo->modulus).v[1];
  if (lVar8 != 0) {
    bVar23 = CARRY8(uVar18,lVar9 * lVar8);
    uVar18 = uVar18 + lVar9 * lVar8;
    lVar21 = lVar21 + SUB168(SEXT816(lVar9) * SEXT816(lVar8),8) + (ulong)bVar23;
    bVar23 = CARRY8(uVar17,lVar20 * lVar8);
    uVar17 = uVar17 + lVar20 * lVar8;
    lVar12 = lVar12 + SUB168(SEXT816(lVar20) * SEXT816(lVar8),8) + (ulong)bVar23;
  }
  uVar11 = lVar21 << 2 | uVar18 >> 0x3e;
  uVar10 = lVar12 << 2 | uVar17 >> 0x3e;
  uVar13 = uVar5 * lVar19 + uVar4 * lVar1;
  uVar22 = uVar13 + uVar11;
  lVar8 = d->v[3];
  lVar14 = SUB168(SEXT816((long)uVar5) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar4) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar5 * lVar19,uVar4 * lVar1) + (lVar21 >> 0x3e) +
           (ulong)CARRY8(uVar13,uVar11);
  lVar21 = e->v[3];
  d->v[0] = uVar18 & 0x3fffffffffffffff;
  e->v[0] = uVar17 & 0x3fffffffffffffff;
  uVar11 = uVar7 * lVar19 + uVar6 * lVar1;
  uVar17 = uVar11 + uVar10;
  lVar19 = SUB168(SEXT816((long)uVar7) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar7 * lVar19,uVar6 * lVar1) + (lVar12 >> 0x3e) +
           (ulong)CARRY8(uVar11,uVar10);
  lVar1 = (modinfo->modulus).v[2];
  if (lVar1 != 0) {
    bVar23 = CARRY8(uVar22,lVar1 * lVar9);
    uVar22 = uVar22 + lVar1 * lVar9;
    lVar14 = lVar14 + SUB168(SEXT816(lVar1) * SEXT816(lVar9),8) + (ulong)bVar23;
    bVar23 = CARRY8(uVar17,lVar1 * lVar20);
    uVar17 = uVar17 + lVar1 * lVar20;
    lVar19 = lVar19 + SUB168(SEXT816(lVar1) * SEXT816(lVar20),8) + (ulong)bVar23;
  }
  uVar11 = lVar14 << 2 | uVar22 >> 0x3e;
  uVar13 = lVar19 << 2 | uVar17 >> 0x3e;
  uVar18 = uVar5 * lVar21 + uVar4 * lVar8;
  uVar10 = uVar18 + uVar11;
  lVar12 = SUB168(SEXT816((long)uVar5) * SEXT816(lVar21),8) +
           SUB168(SEXT816((long)uVar4) * SEXT816(lVar8),8) +
           (ulong)CARRY8(uVar5 * lVar21,uVar4 * lVar8) + (lVar14 >> 0x3e) +
           (ulong)CARRY8(uVar18,uVar11);
  d->v[1] = uVar22 & 0x3fffffffffffffff;
  e->v[1] = uVar17 & 0x3fffffffffffffff;
  uVar11 = uVar7 * lVar21 + uVar6 * lVar8;
  uVar17 = uVar11 + uVar13;
  lVar19 = SUB168(SEXT816((long)uVar7) * SEXT816(lVar21),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar8),8) +
           (ulong)CARRY8(uVar7 * lVar21,uVar6 * lVar8) + (lVar19 >> 0x3e) +
           (ulong)CARRY8(uVar11,uVar13);
  lVar1 = (modinfo->modulus).v[3];
  if (lVar1 != 0) {
    bVar23 = CARRY8(uVar10,lVar1 * lVar9);
    uVar10 = uVar10 + lVar1 * lVar9;
    lVar12 = lVar12 + SUB168(SEXT816(lVar1) * SEXT816(lVar9),8) + (ulong)bVar23;
    bVar23 = CARRY8(uVar17,lVar1 * lVar20);
    uVar17 = uVar17 + lVar1 * lVar20;
    lVar19 = lVar19 + SUB168(SEXT816(lVar1) * SEXT816(lVar20),8) + (ulong)bVar23;
  }
  uVar11 = lVar12 << 2 | uVar10 >> 0x3e;
  uVar13 = lVar19 << 2 | uVar17 >> 0x3e;
  d->v[2] = uVar10 & 0x3fffffffffffffff;
  e->v[2] = uVar17 & 0x3fffffffffffffff;
  lVar1 = (modinfo->modulus).v[4];
  uVar17 = uVar5 * lVar3 + uVar4 * lVar2;
  uVar18 = uVar17 + uVar11;
  uVar22 = uVar18 + lVar1 * lVar9;
  uVar10 = uVar7 * lVar3 + uVar6 * lVar2;
  uVar15 = uVar10 + uVar13;
  uVar16 = uVar15 + lVar1 * lVar20;
  d->v[3] = uVar22 & 0x3fffffffffffffff;
  e->v[3] = uVar16 & 0x3fffffffffffffff;
  d->v[4] = (SUB168(SEXT816((long)uVar5) * SEXT816(lVar3),8) +
             SUB168(SEXT816((long)uVar4) * SEXT816(lVar2),8) +
             (ulong)CARRY8(uVar5 * lVar3,uVar4 * lVar2) + (lVar12 >> 0x3e) +
             (ulong)CARRY8(uVar17,uVar11) + SUB168(SEXT816(lVar1) * SEXT816(lVar9),8) +
            (ulong)CARRY8(uVar18,lVar1 * lVar9)) * 4 | uVar22 >> 0x3e;
  e->v[4] = (SUB168(SEXT816((long)uVar7) * SEXT816(lVar3),8) +
             SUB168(SEXT816((long)uVar6) * SEXT816(lVar2),8) +
             (ulong)CARRY8(uVar7 * lVar3,uVar6 * lVar2) + (lVar19 >> 0x3e) +
             (ulong)CARRY8(uVar10,uVar13) + SUB168(SEXT816(lVar1) * SEXT816(lVar20),8) +
            (ulong)CARRY8(uVar15,lVar1 * lVar20)) * 4 | uVar16 >> 0x3e;
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}